

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parent.cpp
# Opt level: O1

string * fs_parent_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string_view path_00;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  bool bVar5;
  string_view in;
  string p;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  size_t in_stack_ffffffffffffff88;
  _Alloc_hider in_stack_ffffffffffffff90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  path local_50;
  
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,path._M_str,path._M_str + path._M_len);
  in._M_str = local_b8._M_dataplus._M_p;
  in._M_len = local_b8._M_string_length;
  fs_drop_slash_abi_cxx11_(&local_98,in);
  std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_50,&local_b8,auto_format);
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::__cxx11::path::generic_string<char,std::char_traits<char>,std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff90,(path *)&local_98,&local_b9);
  std::__cxx11::string::operator=((string *)&local_b8,(string *)&stack0xffffffffffffff90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_ffffffffffffff90._M_p != &local_60) {
    operator_delete(in_stack_ffffffffffffff90._M_p,local_60._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path((path *)&local_98);
  std::filesystem::__cxx11::path::~path(&local_50);
  if (local_b8._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,".","");
    goto LAB_0011ef91;
  }
  _Var3 = fs_is_windows();
  if ((_Var3) && (local_b8._M_string_length != 0)) {
    path_00._M_str = in_stack_ffffffffffffff90._M_p;
    path_00._M_len = in_stack_ffffffffffffff88;
    fs_root_name_abi_cxx11_(path_00);
    if (local_b8._M_string_length != local_98._M_string_length) {
      bVar2 = true;
      goto LAB_0011eefd;
    }
    bVar2 = true;
    if (local_b8._M_string_length == 0) {
      bVar5 = true;
    }
    else {
      iVar4 = bcmp(local_b8._M_dataplus._M_p,local_98._M_dataplus._M_p,local_b8._M_string_length);
      bVar5 = iVar4 == 0;
    }
  }
  else {
    bVar2 = false;
LAB_0011eefd:
    bVar5 = false;
  }
  if ((bVar2) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2)) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (bVar5) {
    std::__cxx11::string::push_back((char)&local_b8);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p == paVar1) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,local_b8.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_b8.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_b8._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,local_b8.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_b8._M_string_length;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_b8._M_dataplus._M_p = (pointer)paVar1;
LAB_0011ef91:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fs_parent(std::string_view path)
{

  std::string p(path);

#ifdef HAVE_CXX_FILESYSTEM
  p = fs_drop_slash(p);
  // have to drop trailing slash to get expected parent path -- necessary for AppleClang
  p = std::filesystem::path(p).parent_path().generic_string();

  if(fs_trace) std::cout << "TRACE:parent(" << path << ") => " << p << "\n";

// 30.10.7.1 [fs.path.generic] dot-dot in the root-directory refers to the root-directory itself.
// On Windows, a drive specifier such as "C:" or "z:" is treated as a root-name.
// On Cygwin, a path that begins with two successive directory separators is a root-name.
// Otherwise (for POSIX-like systems other than Cygwin), the implementation-defined root-name
// is an unspecified string which does not appear in any pathnames.

#elif defined(_WIN32)
  p = fs_drop_slash(p);
  std::string dir(_MAX_DIR, '\0');
  std::string drive(_MAX_DRIVE, '\0');
  if(_splitpath_s(p.data(), drive.data(), _MAX_DRIVE, dir.data(), _MAX_DIR, nullptr, 0, nullptr, 0) != 0)
    return {};

  p = fs_drop_slash(fs_trim(drive) + fs_trim(dir));
#else
  char* d = dirname(p.data());
  return d ? d : "";
#endif

  if (p.empty())
    return ".";

  // need this for <filesystem> or _splitpath_s to make x: x:/
  if (fs_is_windows() && !p.empty() && p == fs_root_name(p))
    p.push_back('/');

  return p;
}